

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFUnit::findRnglistFromIndex
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFUnit *this,uint32_t Index)

{
  bool *Err;
  bool bVar1;
  unsigned_long *puVar2;
  char *Msg;
  Optional<unsigned_long> OVar3;
  error_code EC;
  error_code EC_00;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_40;
  Optional<unsigned_long> Offset;
  Error local_28;
  uint32_t local_1c;
  uint32_t Index_local;
  
  local_1c = Index;
  OVar3 = getRnglistOffset(this,Index);
  local_40 = OVar3.Storage.field_0;
  Offset.Storage.field_0.empty = OVar3.Storage.hasVal;
  if (((undefined1  [16])OVar3.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar1 = (this->RngListTable).Storage.hasVal;
    Msg = (char *)std::_V2::generic_category();
    if (bVar1 == true) {
      Err = &Offset.Storage.hasVal;
      EC._M_cat = (error_category *)0x16;
      EC._0_8_ = Err;
      createStringError<unsigned_int>(EC,Msg,(uint *)"invalid range list table index %d");
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,(Error *)Err);
    }
    else {
      EC_00._M_cat = (error_category *)0x16;
      EC_00._0_8_ = &local_28;
      createStringError(EC_00,Msg);
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,&local_28);
      Offset.Storage._8_8_ = local_28.Payload;
    }
    if ((long *)(Offset.Storage._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(Offset.Storage._8_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  else {
    puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&local_40);
    findRnglistFromOffset(__return_storage_ptr__,this,this->RangeSectionBase + *puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector>
DWARFUnit::findRnglistFromIndex(uint32_t Index) {
  if (auto Offset = getRnglistOffset(Index))
    return findRnglistFromOffset(*Offset + RangeSectionBase);

  if (RngListTable)
    return createStringError(errc::invalid_argument,
                             "invalid range list table index %d", Index);

  return createStringError(errc::invalid_argument,
                           "missing or invalid range list table");
}